

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O2

int EC_POINT_set_affine_coordinates_GFp(EC_GROUP *group,EC_POINT *p,BIGNUM *x,BIGNUM *y,BN_CTX *ctx)

{
  code *pcVar1;
  int iVar2;
  uint uVar3;
  
  pcVar1 = *(code **)(*(long *)group + 0x88);
  uVar3 = 0;
  if ((pcVar1 != (code *)0x0) && (*(long *)group == *(long *)p)) {
    iVar2 = (*pcVar1)(group,p);
    if (iVar2 != 0) {
      iVar2 = EC_POINT_is_on_curve(group,p,ctx);
      uVar3 = (uint)(0 < iVar2);
    }
  }
  return uVar3;
}

Assistant:

int EC_POINT_set_affine_coordinates_GFp(const EC_GROUP *group,
                                        EC_POINT *point, const BIGNUM *x,
                                        const BIGNUM *y, BN_CTX *ctx)
{
    if (group->meth->point_set_affine_coordinates == 0) {
        //ECerr(EC_F_EC_POINT_SET_AFFINE_COORDINATES_GFP,
            //   ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
        return 0;
    }

    if (group->meth != point->meth) {
        //ECerr(EC_F_EC_POINT_SET_AFFINE_COORDINATES_GFP,
            //   EC_R_INCOMPATIBLE_OBJECTS);
        return 0;
    }

    if (!group->meth->point_set_affine_coordinates(group, point, x, y, ctx))
        return 0;

    if (EC_POINT_is_on_curve(group, point, ctx) <= 0) {
        //ECerr(EC_F_EC_POINT_SET_AFFINE_COORDINATES_GFP,
            //   EC_R_POINT_IS_NOT_ON_CURVE);
        return 0;
    }
    return 1;
}